

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

uint __thiscall Assimp::FBX::FBXConverter::GetDefaultMaterial(FBXConverter *this)

{
  uint uVar1;
  aiMaterial *this_00;
  size_type sVar2;
  undefined1 local_43c [8];
  aiString s;
  aiColor3D diffuse;
  aiMaterial *local_20;
  aiMaterial *out_mat;
  FBXConverter *this_local;
  
  if (this->defaultMaterialIndex == 0) {
    out_mat = (aiMaterial *)this;
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    local_20 = this_00;
    std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(&this->materials,&local_20);
    aiColor3D::aiColor3D((aiColor3D *)(s.data + 0x3f8),0.8,0.8,0.8);
    aiMaterial::AddProperty(local_20,(aiColor3D *)(s.data + 0x3f8),1,"$clr.diffuse",0,0);
    aiString::aiString((aiString *)local_43c);
    aiString::Set((aiString *)local_43c,"DefaultMaterial");
    aiMaterial::AddProperty(local_20,(aiString *)local_43c,"?mat.name",0,0);
    sVar2 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(&this->materials);
    this->defaultMaterialIndex = (uint)sVar2;
    uVar1 = this->defaultMaterialIndex;
  }
  else {
    uVar1 = this->defaultMaterialIndex;
  }
  this_local._4_4_ = uVar1 - 1;
  return this_local._4_4_;
}

Assistant:

unsigned int FBXConverter::GetDefaultMaterial()
        {
            if (defaultMaterialIndex) {
                return defaultMaterialIndex - 1;
            }

            aiMaterial* out_mat = new aiMaterial();
            materials.push_back(out_mat);

            const aiColor3D diffuse = aiColor3D(0.8f, 0.8f, 0.8f);
            out_mat->AddProperty(&diffuse, 1, AI_MATKEY_COLOR_DIFFUSE);

            aiString s;
            s.Set(AI_DEFAULT_MATERIAL_NAME);

            out_mat->AddProperty(&s, AI_MATKEY_NAME);

            defaultMaterialIndex = static_cast<unsigned int>(materials.size());
            return defaultMaterialIndex - 1;
        }